

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O2

QShaderDescriptionPrivate * __thiscall
QShaderDescriptionPrivate::makeDoc(QShaderDescriptionPrivate *this)

{
  char *pcVar1;
  int *piVar2;
  TessellationWindingOrder *data;
  Int IVar3;
  char cVar4;
  iterator ba;
  iterator iVar5;
  iterator ba_00;
  iterator iVar6;
  iterator ba_01;
  iterator iVar7;
  reference pvVar8;
  QLatin1String *pQVar9;
  char *pcVar10;
  TessellationWindingOrder *pTVar11;
  long in_RSI;
  StorageBlock *b_2;
  BlockVariable *v_4;
  long lVar12;
  InOutVariable *v;
  InOutVariable *pIVar13;
  BlockVariable *v_2;
  size_type __n;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  QLatin1StringView QVar15;
  QJsonObject sampler_1;
  QJsonArray jseparateSamplers;
  QJsonArray jseparateImages;
  QJsonArray joutBuiltins;
  QJsonArray jinBuiltins;
  QJsonArray jstorageImages;
  QJsonArray jcombinedSamplers;
  QJsonArray jstorageBlocks;
  QJsonArray members;
  undefined1 local_90 [24];
  QJsonArray jpushConstantBlocks;
  QJsonArray juniformBlocks;
  QJsonArray joutputs;
  QJsonArray jinputs;
  QJsonObject root;
  QJsonValue local_50 [24];
  BlockVariable *local_38;
  
  local_38 = *(BlockVariable **)(in_FS_OFFSET + 0x28);
  _root = (int *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject(&root);
  _jinputs = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray(&jinputs);
  for (lVar12 = *(long *)(in_RSI + 0x18) * 0x68; lVar12 != 0; lVar12 = lVar12 + -0x68) {
    inOutObject((InOutVariable *)local_90);
    QJsonValue::QJsonValue(local_50,(QJsonObject *)local_90);
    QJsonArray::append((QJsonValue *)&jinputs);
    QJsonValue::~QJsonValue(local_50);
    QJsonObject::~QJsonObject((QJsonObject *)local_90);
  }
  cVar4 = QJsonArray::isEmpty();
  if (cVar4 == '\0') {
    QJsonValue::QJsonValue(local_50,&jinputs);
    QtPrivate::lengthHelperPointer<char>("inputs");
    local_90._0_16_ = QJsonObject::operator[]((QLatin1String *)&root);
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  _joutputs = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray(&joutputs);
  for (lVar12 = *(long *)(in_RSI + 0x30) * 0x68; lVar12 != 0; lVar12 = lVar12 + -0x68) {
    inOutObject((InOutVariable *)local_90);
    QJsonValue::QJsonValue(local_50,(QJsonObject *)local_90);
    QJsonArray::append((QJsonValue *)&joutputs);
    QJsonValue::~QJsonValue(local_50);
    QJsonObject::~QJsonObject((QJsonObject *)local_90);
  }
  cVar4 = QJsonArray::isEmpty();
  if (cVar4 == '\0') {
    QJsonValue::QJsonValue(local_50,&joutputs);
    QtPrivate::lengthHelperPointer<char>("outputs");
    auVar14 = QJsonObject::operator[]((QLatin1String *)&root);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  _juniformBlocks = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray(&juniformBlocks);
  ba = QList<QShaderDescription::UniformBlock>::begin
                 ((QList<QShaderDescription::UniformBlock> *)(in_RSI + 0x38));
  iVar5 = QList<QShaderDescription::UniformBlock>::end
                    ((QList<QShaderDescription::UniformBlock> *)(in_RSI + 0x38));
  for (; ba.i != iVar5.i; ba.i = ba.i + 1) {
    _jpushConstantBlocks = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)&jpushConstantBlocks);
    QString::fromUtf8<void>((QString *)local_90,&(ba.i)->blockName);
    QJsonValue::QJsonValue(local_50,(QString *)local_90);
    blockNameKey();
    _members = (undefined1 *)QJsonObject::operator[]((QLatin1String *)&jpushConstantBlocks);
    QJsonValueRef::operator=((QJsonValueRef *)&members,local_50);
    QJsonValue::~QJsonValue(local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_90);
    QString::fromUtf8<void>((QString *)local_90,&(ba.i)->structName);
    QJsonValue::QJsonValue(local_50,(QString *)local_90);
    QtPrivate::lengthHelperPointer<char>("structName");
    _members = (undefined1 *)QJsonObject::operator[]((QLatin1String *)&jpushConstantBlocks);
    QJsonValueRef::operator=((QJsonValueRef *)&members,local_50);
    QJsonValue::~QJsonValue(local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_90);
    QJsonValue::QJsonValue(local_50,(ba.i)->size);
    sizeKey();
    auVar14 = QJsonObject::operator[]((QLatin1String *)&jpushConstantBlocks);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
    if (-1 < (ba.i)->binding) {
      QJsonValue::QJsonValue(local_50,(ba.i)->binding);
      bindingKey();
      auVar14 = QJsonObject::operator[]((QLatin1String *)&jpushConstantBlocks);
      local_90._0_16_ = auVar14;
      QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
      QJsonValue::~QJsonValue(local_50);
    }
    if (-1 < (ba.i)->descriptorSet) {
      QJsonValue::QJsonValue(local_50,(ba.i)->descriptorSet);
      setKey();
      auVar14 = QJsonObject::operator[]((QLatin1String *)&jpushConstantBlocks);
      local_90._0_16_ = auVar14;
      QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
      QJsonValue::~QJsonValue(local_50);
    }
    _members = &DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray(&members);
    for (lVar12 = ((ba.i)->members).d.size * 0x68; lVar12 != 0; lVar12 = lVar12 + -0x68) {
      blockMemberObject((BlockVariable *)local_90);
      QJsonValue::QJsonValue(local_50,(QJsonObject *)local_90);
      QJsonArray::append((QJsonValue *)&members);
      QJsonValue::~QJsonValue(local_50);
      QJsonObject::~QJsonObject((QJsonObject *)local_90);
    }
    QJsonValue::QJsonValue(local_50,&members);
    membersKey();
    auVar14 = QJsonObject::operator[]((QLatin1String *)&jpushConstantBlocks);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
    QJsonValue::QJsonValue(local_50,(QJsonObject *)&jpushConstantBlocks);
    QJsonArray::append((QJsonValue *)&juniformBlocks);
    QJsonValue::~QJsonValue(local_50);
    QJsonArray::~QJsonArray(&members);
    QJsonObject::~QJsonObject((QJsonObject *)&jpushConstantBlocks);
  }
  cVar4 = QJsonArray::isEmpty();
  if (cVar4 == '\0') {
    QJsonValue::QJsonValue(local_50,&juniformBlocks);
    QtPrivate::lengthHelperPointer<char>("uniformBlocks");
    auVar14 = QJsonObject::operator[]((QLatin1String *)&root);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  _jpushConstantBlocks = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray(&jpushConstantBlocks);
  ba_00 = QList<QShaderDescription::PushConstantBlock>::begin
                    ((QList<QShaderDescription::PushConstantBlock> *)(in_RSI + 0x50));
  iVar6 = QList<QShaderDescription::PushConstantBlock>::end
                    ((QList<QShaderDescription::PushConstantBlock> *)(in_RSI + 0x50));
  for (; ba_00.i != iVar6.i; ba_00.i = ba_00.i + 1) {
    _jstorageBlocks = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)&jstorageBlocks);
    QString::fromUtf8<void>((QString *)local_90,&(ba_00.i)->name);
    QJsonValue::QJsonValue(local_50,(QString *)local_90);
    nameKey();
    _members = (undefined1 *)QJsonObject::operator[]((QLatin1String *)&jstorageBlocks);
    QJsonValueRef::operator=((QJsonValueRef *)&members,local_50);
    QJsonValue::~QJsonValue(local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_90);
    QJsonValue::QJsonValue(local_50,(ba_00.i)->size);
    sizeKey();
    auVar14 = QJsonObject::operator[]((QLatin1String *)&jstorageBlocks);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
    _members = &DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray(&members);
    for (lVar12 = ((ba_00.i)->members).d.size * 0x68; lVar12 != 0; lVar12 = lVar12 + -0x68) {
      blockMemberObject((BlockVariable *)local_90);
      QJsonValue::QJsonValue(local_50,(QJsonObject *)local_90);
      QJsonArray::append((QJsonValue *)&members);
      QJsonValue::~QJsonValue(local_50);
      QJsonObject::~QJsonObject((QJsonObject *)local_90);
    }
    QJsonValue::QJsonValue(local_50,&members);
    membersKey();
    auVar14 = QJsonObject::operator[]((QLatin1String *)&jstorageBlocks);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
    QJsonValue::QJsonValue(local_50,(QJsonObject *)&jstorageBlocks);
    QJsonArray::append((QJsonValue *)&jpushConstantBlocks);
    QJsonValue::~QJsonValue(local_50);
    QJsonArray::~QJsonArray(&members);
    QJsonObject::~QJsonObject((QJsonObject *)&jstorageBlocks);
  }
  cVar4 = QJsonArray::isEmpty();
  if (cVar4 == '\0') {
    QJsonValue::QJsonValue(local_50,&jpushConstantBlocks);
    QtPrivate::lengthHelperPointer<char>("pushConstantBlocks");
    auVar14 = QJsonObject::operator[]((QLatin1String *)&root);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  _jstorageBlocks = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray(&jstorageBlocks);
  ba_01 = QList<QShaderDescription::StorageBlock>::begin
                    ((QList<QShaderDescription::StorageBlock> *)(in_RSI + 0x68));
  iVar7 = QList<QShaderDescription::StorageBlock>::end
                    ((QList<QShaderDescription::StorageBlock> *)(in_RSI + 0x68));
  for (; ba_01.i != iVar7.i; ba_01.i = ba_01.i + 1) {
    _jcombinedSamplers = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)&jcombinedSamplers);
    QString::fromUtf8<void>((QString *)local_90,&(ba_01.i)->blockName);
    QJsonValue::QJsonValue(local_50,(QString *)local_90);
    blockNameKey();
    _members = (undefined1 *)QJsonObject::operator[]((QLatin1String *)&jcombinedSamplers);
    QJsonValueRef::operator=((QJsonValueRef *)&members,local_50);
    QJsonValue::~QJsonValue(local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_90);
    QString::fromUtf8<void>((QString *)local_90,&(ba_01.i)->instanceName);
    QJsonValue::QJsonValue(local_50,(QString *)local_90);
    QtPrivate::lengthHelperPointer<char>("instanceName");
    _members = (undefined1 *)QJsonObject::operator[]((QLatin1String *)&jcombinedSamplers);
    QJsonValueRef::operator=((QJsonValueRef *)&members,local_50);
    QJsonValue::~QJsonValue(local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_90);
    QJsonValue::QJsonValue(local_50,(ba_01.i)->knownSize);
    QtPrivate::lengthHelperPointer<char>("knownSize");
    auVar14 = QJsonObject::operator[]((QLatin1String *)&jcombinedSamplers);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
    if (-1 < (ba_01.i)->binding) {
      QJsonValue::QJsonValue(local_50,(ba_01.i)->binding);
      bindingKey();
      auVar14 = QJsonObject::operator[]((QLatin1String *)&jcombinedSamplers);
      local_90._0_16_ = auVar14;
      QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
      QJsonValue::~QJsonValue(local_50);
    }
    if (-1 < (ba_01.i)->descriptorSet) {
      QJsonValue::QJsonValue(local_50,(ba_01.i)->descriptorSet);
      setKey();
      auVar14 = QJsonObject::operator[]((QLatin1String *)&jcombinedSamplers);
      local_90._0_16_ = auVar14;
      QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
      QJsonValue::~QJsonValue(local_50);
    }
    if ((ba_01.i)->runtimeArrayStride != 0) {
      QJsonValue::QJsonValue(local_50,(ba_01.i)->runtimeArrayStride);
      QtPrivate::lengthHelperPointer<char>("runtimeArrayStride");
      auVar14 = QJsonObject::operator[]((QLatin1String *)&jcombinedSamplers);
      local_90._0_16_ = auVar14;
      QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
      QJsonValue::~QJsonValue(local_50);
    }
    IVar3 = ((ba_01.i)->qualifierFlags).
            super_QFlagsStorageHelper<QShaderDescription::QualifierFlag,_4>.
            super_QFlagsStorage<QShaderDescription::QualifierFlag>.i;
    if (IVar3 != 0) {
      QJsonValue::QJsonValue(local_50,IVar3);
      QtPrivate::lengthHelperPointer<char>("qualifierFlags");
      auVar14 = QJsonObject::operator[]((QLatin1String *)&jcombinedSamplers);
      local_90._0_16_ = auVar14;
      QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
      QJsonValue::~QJsonValue(local_50);
    }
    _members = &DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray(&members);
    for (lVar12 = ((ba_01.i)->members).d.size * 0x68; lVar12 != 0; lVar12 = lVar12 + -0x68) {
      blockMemberObject((BlockVariable *)local_90);
      QJsonValue::QJsonValue(local_50,(QJsonObject *)local_90);
      QJsonArray::append((QJsonValue *)&members);
      QJsonValue::~QJsonValue(local_50);
      QJsonObject::~QJsonObject((QJsonObject *)local_90);
    }
    QJsonValue::QJsonValue(local_50,&members);
    membersKey();
    auVar14 = QJsonObject::operator[]((QLatin1String *)&jcombinedSamplers);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
    QJsonValue::QJsonValue(local_50,(QJsonObject *)&jcombinedSamplers);
    QJsonArray::append((QJsonValue *)&jstorageBlocks);
    QJsonValue::~QJsonValue(local_50);
    QJsonArray::~QJsonArray(&members);
    QJsonObject::~QJsonObject((QJsonObject *)&jcombinedSamplers);
  }
  cVar4 = QJsonArray::isEmpty();
  if (cVar4 == '\0') {
    QJsonValue::QJsonValue(local_50,&jstorageBlocks);
    QtPrivate::lengthHelperPointer<char>("storageBlocks");
    auVar14 = QJsonObject::operator[]((QLatin1String *)&root);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  _jcombinedSamplers = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray(&jcombinedSamplers);
  pIVar13 = *(InOutVariable **)(in_RSI + 0x88);
  for (lVar12 = *(long *)(in_RSI + 0x90) * 0x68; lVar12 != 0; lVar12 = lVar12 + -0x68) {
    _jstorageImages = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)&jstorageImages);
    QString::fromUtf8<void>((QString *)local_90,&pIVar13->name);
    QJsonValue::QJsonValue(local_50,(QString *)local_90);
    nameKey();
    _members = (undefined1 *)QJsonObject::operator[]((QLatin1String *)&jstorageImages);
    QJsonValueRef::operator=((QJsonValueRef *)&members,local_50);
    QJsonValue::~QJsonValue(local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_90);
    QVar15 = typeStr(pIVar13->type);
    QJsonValue::QJsonValue(local_50,(QLatin1String *)QVar15.m_size);
    typeKey();
    auVar14 = QJsonObject::operator[]((QLatin1String *)&jstorageImages);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
    addDeco((QJsonObject *)&jstorageImages,pIVar13);
    QJsonValue::QJsonValue(local_50,(QJsonObject *)&jstorageImages);
    QJsonArray::append((QJsonValue *)&jcombinedSamplers);
    QJsonValue::~QJsonValue(local_50);
    QJsonObject::~QJsonObject((QJsonObject *)&jstorageImages);
    pIVar13 = pIVar13 + 1;
  }
  cVar4 = QJsonArray::isEmpty();
  if (cVar4 == '\0') {
    QJsonValue::QJsonValue(local_50,&jcombinedSamplers);
    QtPrivate::lengthHelperPointer<char>("combinedImageSamplers");
    auVar14 = QJsonObject::operator[]((QLatin1String *)&root);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  _jstorageImages = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray(&jstorageImages);
  pIVar13 = *(InOutVariable **)(in_RSI + 0xd0);
  for (lVar12 = *(long *)(in_RSI + 0xd8) * 0x68; lVar12 != 0; lVar12 = lVar12 + -0x68) {
    _jinBuiltins = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)&jinBuiltins);
    QString::fromUtf8<void>((QString *)local_90,&pIVar13->name);
    QJsonValue::QJsonValue(local_50,(QString *)local_90);
    nameKey();
    _members = (undefined1 *)QJsonObject::operator[]((QLatin1String *)&jinBuiltins);
    QJsonValueRef::operator=((QJsonValueRef *)&members,local_50);
    QJsonValue::~QJsonValue(local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_90);
    QVar15 = typeStr(pIVar13->type);
    QJsonValue::QJsonValue(local_50,(QLatin1String *)QVar15.m_size);
    typeKey();
    auVar14 = QJsonObject::operator[]((QLatin1String *)&jinBuiltins);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
    addDeco((QJsonObject *)&jinBuiltins,pIVar13);
    QJsonValue::QJsonValue(local_50,(QJsonObject *)&jinBuiltins);
    QJsonArray::append((QJsonValue *)&jstorageImages);
    QJsonValue::~QJsonValue(local_50);
    QJsonObject::~QJsonObject((QJsonObject *)&jinBuiltins);
    pIVar13 = pIVar13 + 1;
  }
  cVar4 = QJsonArray::isEmpty();
  if (cVar4 == '\0') {
    QJsonValue::QJsonValue(local_50,&jstorageImages);
    QtPrivate::lengthHelperPointer<char>("storageImages");
    auVar14 = QJsonObject::operator[]((QLatin1String *)&root);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  _jinBuiltins = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray(&jinBuiltins);
  for (lVar12 = *(long *)(in_RSI + 0xf0) << 5; lVar12 != 0; lVar12 = lVar12 + -0x20) {
    builtinObject((BuiltinVariable *)local_90);
    QJsonValue::QJsonValue(local_50,(QJsonObject *)local_90);
    QJsonArray::append((QJsonValue *)&jinBuiltins);
    QJsonValue::~QJsonValue(local_50);
    QJsonObject::~QJsonObject((QJsonObject *)local_90);
  }
  cVar4 = QJsonArray::isEmpty();
  if (cVar4 == '\0') {
    QJsonValue::QJsonValue(local_50,&jinBuiltins);
    QtPrivate::lengthHelperPointer<char>("inBuiltins");
    auVar14 = QJsonObject::operator[]((QLatin1String *)&root);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  _joutBuiltins = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray(&joutBuiltins);
  for (lVar12 = *(long *)(in_RSI + 0x108) << 5; lVar12 != 0; lVar12 = lVar12 + -0x20) {
    builtinObject((BuiltinVariable *)local_90);
    QJsonValue::QJsonValue(local_50,(QJsonObject *)local_90);
    QJsonArray::append((QJsonValue *)&joutBuiltins);
    QJsonValue::~QJsonValue(local_50);
    QJsonObject::~QJsonObject((QJsonObject *)local_90);
  }
  cVar4 = QJsonArray::isEmpty();
  if (cVar4 == '\0') {
    QJsonValue::QJsonValue(local_50,&joutBuiltins);
    QtPrivate::lengthHelperPointer<char>("outBuiltins");
    auVar14 = QJsonObject::operator[]((QLatin1String *)&root);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  if (((*(int *)(in_RSI + 0x110) != 0) || (*(int *)(in_RSI + 0x114) != 0)) ||
     (*(int *)(in_RSI + 0x118) != 0)) {
    _members = &DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray(&members);
    for (__n = 0; __n != 3; __n = __n + 1) {
      pvVar8 = std::array<unsigned_int,_3UL>::operator[]
                         ((array<unsigned_int,_3UL> *)(in_RSI + 0x110),__n);
      QJsonValue::QJsonValue(local_50,*pvVar8);
      QJsonArray::append((QJsonValue *)&members);
      QJsonValue::~QJsonValue(local_50);
    }
    QJsonValue::QJsonValue(local_50,&members);
    QtPrivate::lengthHelperPointer<char>("computeLocalSize");
    auVar14 = QJsonObject::operator[]((QLatin1String *)&root);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
    QJsonArray::~QJsonArray(&members);
  }
  if (*(int *)(in_RSI + 0x11c) != 0) {
    QJsonValue::QJsonValue(local_50,*(int *)(in_RSI + 0x11c));
    QtPrivate::lengthHelperPointer<char>("tessellationOutputVertexCount");
    auVar14 = QJsonObject::operator[]((QLatin1String *)&root);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  if (*(int *)(in_RSI + 0x120) != 0) {
    lVar12 = 5;
    pQVar9 = (QLatin1String *)0x0;
    pcVar10 = builtinTypeTab[0x1c].k + 0x10;
    do {
      lVar12 = lVar12 + -1;
      if (lVar12 == 0) goto LAB_00402e29;
      pcVar1 = pcVar10 + 0x10;
      piVar2 = (int *)(pcVar10 + 0x1c);
      pcVar10 = pcVar1;
    } while (*piVar2 != *(int *)(in_RSI + 0x120));
    pQVar9 = (QLatin1String *)QtPrivate::lengthHelperPointer<char>(pcVar1);
LAB_00402e29:
    QJsonValue::QJsonValue(local_50,pQVar9);
    QtPrivate::lengthHelperPointer<char>("tessellationMode");
    auVar14 = QJsonObject::operator[]((QLatin1String *)&root);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  if (*(int *)(in_RSI + 0x124) != 0) {
    lVar12 = 4;
    pQVar9 = (QLatin1String *)0x0;
    pcVar10 = tessellationModeTab[3].k + 4;
    do {
      lVar12 = lVar12 + -1;
      if (lVar12 == 0) goto LAB_00402eb8;
      pcVar1 = pcVar10 + 0xc;
      piVar2 = (int *)(pcVar10 + 0x14);
      pcVar10 = pcVar1;
    } while (*piVar2 != *(int *)(in_RSI + 0x124));
    pQVar9 = (QLatin1String *)QtPrivate::lengthHelperPointer<char>(pcVar1);
LAB_00402eb8:
    QJsonValue::QJsonValue(local_50,pQVar9);
    QtPrivate::lengthHelperPointer<char>("tessellationWindingOrder");
    auVar14 = QJsonObject::operator[]((QLatin1String *)&root);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  if (*(int *)(in_RSI + 0x128) != 0) {
    lVar12 = 5;
    pQVar9 = (QLatin1String *)0x0;
    pTVar11 = &tessellationWindingOrderTab[1].v;
    do {
      lVar12 = lVar12 + -1;
      if (lVar12 == 0) goto LAB_00402f47;
      data = pTVar11 + 7;
      piVar2 = (int *)(pTVar11 + 0xd);
      pTVar11 = data;
    } while (*piVar2 != *(int *)(in_RSI + 0x128));
    pQVar9 = (QLatin1String *)QtPrivate::lengthHelperPointer<char>((char *)data);
LAB_00402f47:
    QJsonValue::QJsonValue(local_50,pQVar9);
    QtPrivate::lengthHelperPointer<char>("tessellationPartitioning");
    auVar14 = QJsonObject::operator[]((QLatin1String *)&root);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  _jseparateImages = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray(&jseparateImages);
  pIVar13 = *(InOutVariable **)(in_RSI + 0xa0);
  for (lVar12 = *(long *)(in_RSI + 0xa8) * 0x68; lVar12 != 0; lVar12 = lVar12 + -0x68) {
    _jseparateSamplers = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)&jseparateSamplers);
    QString::fromUtf8<void>((QString *)local_90,&pIVar13->name);
    QJsonValue::QJsonValue(local_50,(QString *)local_90);
    nameKey();
    _members = (undefined1 *)QJsonObject::operator[]((QLatin1String *)&jseparateSamplers);
    QJsonValueRef::operator=((QJsonValueRef *)&members,local_50);
    QJsonValue::~QJsonValue(local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_90);
    QVar15 = typeStr(pIVar13->type);
    QJsonValue::QJsonValue(local_50,(QLatin1String *)QVar15.m_size);
    typeKey();
    auVar14 = QJsonObject::operator[]((QLatin1String *)&jseparateSamplers);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
    addDeco((QJsonObject *)&jseparateSamplers,pIVar13);
    QJsonValue::QJsonValue(local_50,(QJsonObject *)&jseparateSamplers);
    QJsonArray::append((QJsonValue *)&jseparateImages);
    QJsonValue::~QJsonValue(local_50);
    QJsonObject::~QJsonObject((QJsonObject *)&jseparateSamplers);
    pIVar13 = pIVar13 + 1;
  }
  cVar4 = QJsonArray::isEmpty();
  if (cVar4 == '\0') {
    QJsonValue::QJsonValue(local_50,&jseparateImages);
    QtPrivate::lengthHelperPointer<char>("separateImages");
    auVar14 = QJsonObject::operator[]((QLatin1String *)&root);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  _jseparateSamplers = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray(&jseparateSamplers);
  pIVar13 = *(InOutVariable **)(in_RSI + 0xb8);
  for (lVar12 = *(long *)(in_RSI + 0xc0) * 0x68; lVar12 != 0; lVar12 = lVar12 + -0x68) {
    _sampler_1 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject(&sampler_1);
    QString::fromUtf8<void>((QString *)local_90,&pIVar13->name);
    QJsonValue::QJsonValue(local_50,(QString *)local_90);
    nameKey();
    _members = (undefined1 *)QJsonObject::operator[]((QLatin1String *)&sampler_1);
    QJsonValueRef::operator=((QJsonValueRef *)&members,local_50);
    QJsonValue::~QJsonValue(local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_90);
    QVar15 = typeStr(pIVar13->type);
    QJsonValue::QJsonValue(local_50,(QLatin1String *)QVar15.m_size);
    typeKey();
    auVar14 = QJsonObject::operator[]((QLatin1String *)&sampler_1);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
    addDeco(&sampler_1,pIVar13);
    QJsonValue::QJsonValue(local_50,&sampler_1);
    QJsonArray::append((QJsonValue *)&jseparateSamplers);
    QJsonValue::~QJsonValue(local_50);
    QJsonObject::~QJsonObject(&sampler_1);
    pIVar13 = pIVar13 + 1;
  }
  cVar4 = QJsonArray::isEmpty();
  if (cVar4 == '\0') {
    QJsonValue::QJsonValue(local_50,&jseparateSamplers);
    QtPrivate::lengthHelperPointer<char>("separateSamplers");
    auVar14 = QJsonObject::operator[]((QLatin1String *)&root);
    local_90._0_16_ = auVar14;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  QJsonDocument::QJsonDocument((QJsonDocument *)this,&root);
  QJsonArray::~QJsonArray(&jseparateSamplers);
  QJsonArray::~QJsonArray(&jseparateImages);
  QJsonArray::~QJsonArray(&joutBuiltins);
  QJsonArray::~QJsonArray(&jinBuiltins);
  QJsonArray::~QJsonArray(&jstorageImages);
  QJsonArray::~QJsonArray(&jcombinedSamplers);
  QJsonArray::~QJsonArray(&jstorageBlocks);
  QJsonArray::~QJsonArray(&jpushConstantBlocks);
  QJsonArray::~QJsonArray(&juniformBlocks);
  QJsonArray::~QJsonArray(&joutputs);
  QJsonArray::~QJsonArray(&jinputs);
  QJsonObject::~QJsonObject(&root);
  if (*(BlockVariable **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QJsonDocument QShaderDescriptionPrivate::makeDoc()
{
    QJsonObject root;

    QJsonArray jinputs;
    for (const QShaderDescription::InOutVariable &v : std::as_const(inVars))
        jinputs.append(inOutObject(v));
    if (!jinputs.isEmpty())
        root[inputsKey()] = jinputs;

    QJsonArray joutputs;
    for (const QShaderDescription::InOutVariable &v : std::as_const(outVars))
        joutputs.append(inOutObject(v));
    if (!joutputs.isEmpty())
        root[outputsKey()] = joutputs;

    QJsonArray juniformBlocks;
    for (const QShaderDescription::UniformBlock &b : uniformBlocks) {
        QJsonObject juniformBlock;
        juniformBlock[blockNameKey()] = QString::fromUtf8(b.blockName);
        juniformBlock[structNameKey()] = QString::fromUtf8(b.structName);
        juniformBlock[sizeKey()] = b.size;
        if (b.binding >= 0)
            juniformBlock[bindingKey()] = b.binding;
        if (b.descriptorSet >= 0)
            juniformBlock[setKey()] = b.descriptorSet;
        QJsonArray members;
        for (const QShaderDescription::BlockVariable &v : b.members)
            members.append(blockMemberObject(v));
        juniformBlock[membersKey()] = members;
        juniformBlocks.append(juniformBlock);
    }
    if (!juniformBlocks.isEmpty())
        root[uniformBlocksKey()] = juniformBlocks;

    QJsonArray jpushConstantBlocks;
    for (const QShaderDescription::PushConstantBlock &b : pushConstantBlocks) {
        QJsonObject jpushConstantBlock;
        jpushConstantBlock[nameKey()] = QString::fromUtf8(b.name);
        jpushConstantBlock[sizeKey()] = b.size;
        QJsonArray members;
        for (const QShaderDescription::BlockVariable &v : b.members)
            members.append(blockMemberObject(v));
        jpushConstantBlock[membersKey()] = members;
        jpushConstantBlocks.append(jpushConstantBlock);
    }
    if (!jpushConstantBlocks.isEmpty())
        root[pushConstantBlocksKey()] = jpushConstantBlocks;

    QJsonArray jstorageBlocks;
    for (const QShaderDescription::StorageBlock &b : storageBlocks) {
        QJsonObject jstorageBlock;
        jstorageBlock[blockNameKey()] = QString::fromUtf8(b.blockName);
        jstorageBlock[instanceNameKey()] = QString::fromUtf8(b.instanceName);
        jstorageBlock[knownSizeKey()] = b.knownSize;
        if (b.binding >= 0)
            jstorageBlock[bindingKey()] = b.binding;
        if (b.descriptorSet >= 0)
            jstorageBlock[setKey()] = b.descriptorSet;
        if (b.runtimeArrayStride)
            jstorageBlock[runtimeArrayStrideKey()] = b.runtimeArrayStride;
        if (b.qualifierFlags)
            jstorageBlock[qualifierFlagsKey()] = int(b.qualifierFlags);
        QJsonArray members;
        for (const QShaderDescription::BlockVariable &v : b.members)
            members.append(blockMemberObject(v));
        jstorageBlock[membersKey()] = members;
        jstorageBlocks.append(jstorageBlock);
    }
    if (!jstorageBlocks.isEmpty())
        root[storageBlocksKey()] = jstorageBlocks;

    QJsonArray jcombinedSamplers;
    for (const QShaderDescription::InOutVariable &v : std::as_const(combinedImageSamplers)) {
        QJsonObject sampler;
        sampler[nameKey()] = QString::fromUtf8(v.name);
        sampler[typeKey()] = typeStr(v.type);
        addDeco(&sampler, v);
        jcombinedSamplers.append(sampler);
    }
    if (!jcombinedSamplers.isEmpty())
        root[combinedImageSamplersKey()] = jcombinedSamplers;

    QJsonArray jstorageImages;
    for (const QShaderDescription::InOutVariable &v : std::as_const(storageImages)) {
        QJsonObject image;
        image[nameKey()] = QString::fromUtf8(v.name);
        image[typeKey()] = typeStr(v.type);
        addDeco(&image, v);
        jstorageImages.append(image);
    }
    if (!jstorageImages.isEmpty())
        root[storageImagesKey()] = jstorageImages;

    QJsonArray jinBuiltins;
    for (const QShaderDescription::BuiltinVariable &v : std::as_const(inBuiltins))
        jinBuiltins.append(builtinObject(v));
    if (!jinBuiltins.isEmpty())
        root[inBuiltinsKey()] = jinBuiltins;

    QJsonArray joutBuiltins;
    for (const QShaderDescription::BuiltinVariable &v : std::as_const(outBuiltins))
        joutBuiltins.append(builtinObject(v));
    if (!joutBuiltins.isEmpty())
        root[outBuiltinsKey()] = joutBuiltins;

    if (localSize[0] || localSize[1] || localSize[2]) {
        QJsonArray jlocalSize;
        for (size_t i = 0; i < 3; ++i)
            jlocalSize.append(QJsonValue(int(localSize[i])));
        root[computeLocalSizeKey()] = jlocalSize;
    }

    if (tessOutVertCount)
        root[tessellationOutputVertexCountKey()] = int(tessOutVertCount);

    if (tessMode != QShaderDescription::UnknownTessellationMode)
        root[tessellationModeKey()] = tessModeStr(tessMode);

    if (tessWind != QShaderDescription::UnknownTessellationWindingOrder)
        root[tessellationWindingOrderKey()] = tessWindStr(tessWind);

    if (tessPart != QShaderDescription::UnknownTessellationPartitioning)
        root[tessellationPartitioningKey()] = tessPartStr(tessPart);

    QJsonArray jseparateImages;
    for (const QShaderDescription::InOutVariable &v : std::as_const(separateImages)) {
        QJsonObject image;
        image[nameKey()] = QString::fromUtf8(v.name);
        image[typeKey()] = typeStr(v.type);
        addDeco(&image, v);
        jseparateImages.append(image);
    }
    if (!jseparateImages.isEmpty())
        root[separateImagesKey()] = jseparateImages;

    QJsonArray jseparateSamplers;
    for (const QShaderDescription::InOutVariable &v : std::as_const(separateSamplers)) {
        QJsonObject sampler;
        sampler[nameKey()] = QString::fromUtf8(v.name);
        sampler[typeKey()] = typeStr(v.type);
        addDeco(&sampler, v);
        jseparateSamplers.append(sampler);
    }
    if (!jseparateSamplers.isEmpty())
        root[separateSamplersKey()] = jseparateSamplers;

    return QJsonDocument(root);
}